

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t * flatcc_builder_table_add_offset(flatcc_builder_t *B,int id)

{
  flatcc_builder_ref_t *pfVar1;
  int id_local;
  flatcc_builder_t *B_local;
  
  if (B->frame->type != 3) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x738,
                  "flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *, int)");
  }
  if ((-1 < id) && (id < 0x7ffd)) {
    if (B->vs[id] != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x740,
                    "flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *, int)"
                   );
    }
    B->vt_hash = ((id ^ B->vt_hash) * -0x61c8864f ^ 4) * -0x61c8864f;
    pfVar1 = (flatcc_builder_ref_t *)push_ds_offset_field(B,(flatbuffers_voffset_t)id);
    return pfVar1;
  }
  __assert_fail("id >= 0 && id <= (int)((65535) / sizeof(flatbuffers_voffset_t) - 3)",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x739,
                "flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *, int)");
}

Assistant:

flatcc_builder_ref_t *flatcc_builder_table_add_offset(flatcc_builder_t *B, int id)
{
    check(frame(type) == flatcc_builder_table, "expected table frame");
    check(id >= 0 && id <= (int)FLATBUFFERS_ID_MAX, "table id out of range");
#if FLATCC_BUILDER_ALLOW_REPEAT_TABLE_ADD
    if (B->vs[id] != 0) {
        return B->ds + B->vs[id] - field_size;
    }
#else
    if (B->vs[id] != 0) {
        check(0, "table field already set");
        return 0;
    }
#endif
    FLATCC_BUILDER_UPDATE_VT_HASH(B->vt_hash, (uint32_t)id, (uint32_t)field_size);
    return push_ds_offset_field(B, (voffset_t)id);
}